

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_gsub(lua_State *L)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 extraout_var;
  char *e;
  void *pvVar8;
  size_t sVar9;
  char cVar10;
  lua_Integer n;
  char *pcVar11;
  lua_State *plVar12;
  uint local_6cc;
  size_t l;
  lua_State *local_6b8;
  size_t lp;
  undefined8 local_6a8;
  char *local_6a0;
  lua_State *local_698;
  lua_Integer local_690;
  size_t srcl;
  char *local_680;
  luaL_Buffer b;
  MatchState ms;
  undefined8 uVar7;
  
  pcVar5 = luaL_checklstring(L,1,&srcl);
  pcVar6 = luaL_checklstring(L,2,&lp);
  iVar3 = lua_type(L,3);
  uVar7 = CONCAT44(extraout_var,iVar3);
  local_690 = luaL_optinteger(L,4,srcl + 1);
  cVar1 = *pcVar6;
  if (3 < iVar3 - 3U) {
    luaL_typeerror(L,3,"string/function/table");
  }
  luaL_buffinit(L,&b);
  if (cVar1 == '^') {
    pcVar6 = pcVar6 + 1;
    lp = lp - 1;
  }
  ms.matchdepth = 200;
  ms.src_end = pcVar5 + srcl;
  ms.p_end = pcVar6 + lp;
  n = 0;
  local_6cc = 0;
  pcVar11 = (char *)0x0;
  local_6b8 = L;
  local_6a8 = uVar7;
  local_6a0 = pcVar6;
  ms.src_init = pcVar5;
  ms.L = L;
  do {
    if (local_690 <= n) break;
    ms.level = '\0';
    e = match(&ms,pcVar5,pcVar6);
    plVar12 = ms.L;
    if (e == pcVar11 || e == (char *)0x0) {
      if (ms.src_end <= pcVar5) break;
      if (b.size <= b.n) {
        luaL_prepbuffsize(&b,1);
      }
      b.b[b.n] = *pcVar5;
      e = pcVar11;
      pcVar5 = pcVar5 + 1;
      b.n = b.n + 1;
    }
    else {
      if ((int)uVar7 == 5) {
        push_onecapture(&ms,0,pcVar5,e);
        lua_gettable(plVar12,3);
LAB_0014669d:
        iVar3 = lua_toboolean(plVar12,-1);
        if (iVar3 == 0) {
          lua_settop(plVar12,-2);
          luaL_addlstring(&b,pcVar5,(long)e - (long)pcVar5);
          uVar4 = 0;
        }
        else {
          iVar3 = lua_isstring(plVar12,-1);
          if (iVar3 == 0) {
            iVar3 = lua_type(plVar12,-1);
            pcVar5 = lua_typename(plVar12,iVar3);
            uVar4 = luaL_error(plVar12,"invalid replacement value (a %s)",pcVar5);
          }
          else {
            luaL_addvalue(&b);
            uVar4 = 1;
          }
        }
      }
      else {
        if ((int)uVar7 == 6) {
          lua_pushvalue(ms.L,3);
          iVar3 = push_captures(&ms,pcVar5,e);
          lua_callk(plVar12,iVar3,1,0,(lua_KFunction)0x0);
          goto LAB_0014669d;
        }
        local_698 = ms.L;
        pcVar6 = lua_tolstring(ms.L,3,&l);
        while (sVar9 = l, pvVar8 = memchr(pcVar6,0x25,l), pvVar8 != (void *)0x0) {
          luaL_addlstring(&b,pcVar6,(long)pvVar8 - (long)pcVar6);
          bVar2 = *(byte *)((long)pvVar8 + 1);
          sVar9 = (long)e - (long)pcVar5;
          pcVar11 = pcVar5;
          if (bVar2 == 0x30) {
LAB_00146775:
            luaL_addlstring(&b,pcVar11,sVar9);
          }
          else if (bVar2 == 0x25) {
            cVar10 = '%';
            if (b.size <= b.n) {
              luaL_prepbuffsize(&b,1);
              cVar10 = *(char *)((long)pvVar8 + 1);
            }
            b.b[b.n] = cVar10;
            b.n = b.n + 1;
          }
          else if (bVar2 - 0x30 < 10) {
            sVar9 = get_onecapture(&ms,(char)bVar2 + -0x31,pcVar5,e,&local_680);
            pcVar11 = local_680;
            if (sVar9 != 0xfffffffffffffffe) goto LAB_00146775;
            luaL_addvalue(&b);
          }
          else {
            luaL_error(local_698,"invalid use of \'%c\' in replacement string",0x25);
          }
          l = (size_t)(pcVar6 + (l - ((long)pvVar8 + 2)));
          pcVar6 = (char *)((long)pvVar8 + 2);
        }
        luaL_addlstring(&b,pcVar6,sVar9);
        uVar4 = 1;
        pcVar6 = local_6a0;
        uVar7 = local_6a8;
      }
      n = n + 1;
      local_6cc = local_6cc | uVar4;
      pcVar5 = e;
    }
    pcVar11 = e;
  } while (cVar1 != '^');
  plVar12 = local_6b8;
  if (local_6cc == 0) {
    lua_pushvalue(local_6b8,1);
  }
  else {
    luaL_addlstring(&b,pcVar5,(long)ms.src_end - (long)pcVar5);
    luaL_pushresult(&b);
    plVar12 = local_6b8;
  }
  lua_pushinteger(plVar12,n);
  return 2;
}

Assistant:

static int str_gsub (lua_State *L) {
  size_t srcl, lp;
  const char *src = luaL_checklstring(L, 1, &srcl);  /* subject */
  const char *p = luaL_checklstring(L, 2, &lp);  /* pattern */
  const char *lastmatch = NULL;  /* end of last match */
  int tr = lua_type(L, 3);  /* replacement type */
  lua_Integer max_s = luaL_optinteger(L, 4, srcl + 1);  /* max replacements */
  int anchor = (*p == '^');
  lua_Integer n = 0;  /* replacement count */
  int changed = 0;  /* change flag */
  MatchState ms;
  luaL_Buffer b;
  luaL_argexpected(L, tr == LUA_TNUMBER || tr == LUA_TSTRING ||
                   tr == LUA_TFUNCTION || tr == LUA_TTABLE, 3,
                      "string/function/table");
  luaL_buffinit(L, &b);
  if (anchor) {
    p++; lp--;  /* skip anchor character */
  }
  prepstate(&ms, L, src, srcl, p, lp);
  while (n < max_s) {
    const char *e;
    reprepstate(&ms);  /* (re)prepare state for new match */
    if ((e = match(&ms, src, p)) != NULL && e != lastmatch) {  /* match? */
      n++;
      changed = add_value(&ms, &b, src, e, tr) | changed;
      src = lastmatch = e;
    }
    else if (src < ms.src_end)  /* otherwise, skip one character */
      luaL_addchar(&b, *src++);
    else break;  /* end of subject */
    if (anchor) break;
  }
  if (!changed)  /* no changes? */
    lua_pushvalue(L, 1);  /* return original string */
  else {  /* something changed */
    luaL_addlstring(&b, src, ms.src_end-src);
    luaL_pushresult(&b);  /* create and return new string */
  }
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}